

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O2

void __thiscall FS::Focuser::doSStatus(Focuser *this,CommandPacket cp)

{
  NetInterface *pNVar1;
  char *string;
  
  ::operator<<((this->debugLog)._M_t.
               super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
               super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
               super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl,
               "Processing sstatus request\n");
  pNVar1 = ::operator<<((this->net)._M_t.
                        super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t
                        .super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
                        super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl,"Synched: ");
  string = "NO";
  if (this->isSynched != false) {
    string = "YES";
  }
  pNVar1 = ::operator<<(pNVar1,string);
  ::operator<<(pNVar1,"\n");
  return;
}

Assistant:

void Focuser::doSStatus( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing sstatus request\n";
  *net << "Synched: " << (isSynched ? "YES" : "NO" ) << "\n";
}